

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPutS(Vec_Str_t *vOut,char *pStr)

{
  char *local_18;
  char *pStr_local;
  Vec_Str_t *vOut_local;
  
  local_18 = pStr;
  while (*local_18 != '\0') {
    Vec_StrPush(vOut,*local_18);
    local_18 = local_18 + 1;
  }
  Vec_StrPush(vOut,'\0');
  return;
}

Assistant:

static inline void Vec_StrPutS( Vec_Str_t * vOut, char * pStr )
{
    while ( *pStr )
        Vec_StrPush( vOut, *pStr++ );
    Vec_StrPush( vOut, (char)0 );
}